

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_set_log_callback_ex
          (fdb_file_handle *fhandle,fdb_kvs_handle *handle,fdb_log_callback_ex log_callback,
          void *ctx_data)

{
  void *ctx_data_local;
  fdb_log_callback_ex log_callback_local;
  fdb_kvs_handle *handle_local;
  fdb_file_handle *fhandle_local;
  fdb_status local_4;
  
  if ((fhandle == (fdb_file_handle *)0x0) || (handle == (fdb_kvs_handle *)0x0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    (fhandle->root->log_callback).callback_ex = log_callback;
    (fhandle->root->log_callback).ctx_data = ctx_data;
    (handle->log_callback).callback_ex = log_callback;
    (handle->log_callback).ctx_data = ctx_data;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_log_callback_ex(fdb_file_handle* fhandle,
                                   fdb_kvs_handle* handle,
                                   fdb_log_callback_ex log_callback,
                                   void* ctx_data)
{
    if (!fhandle || !handle) return FDB_RESULT_INVALID_HANDLE;

    fhandle->root->log_callback.callback_ex = log_callback;
    fhandle->root->log_callback.ctx_data = ctx_data;

    handle->log_callback.callback_ex = log_callback;
    handle->log_callback.ctx_data = ctx_data;
    return FDB_RESULT_SUCCESS;
}